

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O3

SignatureData *
transaction_tests::CombineSignatures
          (SignatureData *__return_storage_ptr__,CMutableTransaction *input1,
          CMutableTransaction *input2,CTransactionRef tx)

{
  element_type *peVar1;
  long in_FS_OFFSET;
  SignatureData local_750;
  SignatureData local_3c0;
  long local_30;
  
  peVar1 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  SignatureData::SignatureData(__return_storage_ptr__);
  DataFromTransaction(&local_3c0,input1,0,
                      *(CTxOut **)
                       ((long)&(((peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->prevout).hash + 0x18));
  SignatureData::operator=(__return_storage_ptr__,&local_3c0);
  SignatureData::~SignatureData(&local_3c0);
  DataFromTransaction(&local_750,input2,0,
                      *(CTxOut **)
                       ((long)&(((peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->prevout).hash + 0x18));
  SignatureData::MergeSignatureData(__return_storage_ptr__,&local_750);
  SignatureData::~SignatureData(&local_750);
  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
            ((MutableTransactionSignatureCreator *)&local_3c0,input1,0,
             *(CAmount **)
              ((long)&(((peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->prevout).hash + 0x18),1);
  ProduceSignature(DUMMY_SIGNING_PROVIDER,(BaseSignatureCreator *)&local_3c0,
                   (CScript *)
                   (*(long *)((long)&(((peVar1->vin).
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout).hash + 0x18) + 8)
                   ,__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

SignatureData CombineSignatures(const CMutableTransaction& input1, const CMutableTransaction& input2, const CTransactionRef tx)
{
    SignatureData sigdata;
    sigdata = DataFromTransaction(input1, 0, tx->vout[0]);
    sigdata.MergeSignatureData(DataFromTransaction(input2, 0, tx->vout[0]));
    ProduceSignature(DUMMY_SIGNING_PROVIDER, MutableTransactionSignatureCreator(input1, 0, tx->vout[0].nValue, SIGHASH_ALL), tx->vout[0].scriptPubKey, sigdata);
    return sigdata;
}